

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall
Builder::Builder(Builder *this,State *state,BuildConfig *config,BuildLog *build_log,
                DepsLog *deps_log,DiskInterface *disk_interface)

{
  BuildStatus *this_00;
  DiskInterface *disk_interface_local;
  DepsLog *deps_log_local;
  BuildLog *build_log_local;
  BuildConfig *config_local;
  State *state_local;
  Builder *this_local;
  
  this->state_ = state;
  this->config_ = config;
  Plan::Plan(&this->plan_,this);
  std::unique_ptr<CommandRunner,std::default_delete<CommandRunner>>::
  unique_ptr<std::default_delete<CommandRunner>,void>
            ((unique_ptr<CommandRunner,std::default_delete<CommandRunner>> *)&this->command_runner_)
  ;
  this->disk_interface_ = disk_interface;
  DependencyScan::DependencyScan
            (&this->scan_,state,build_log,deps_log,disk_interface,
             (DepfileParserOptions *)(this->config_ + 0x18));
  this_00 = (BuildStatus *)operator_new(0x128);
  BuildStatus::BuildStatus(this_00,config);
  this->status_ = this_00;
  return;
}

Assistant:

Builder::Builder(State* state, const BuildConfig& config,
                 BuildLog* build_log, DepsLog* deps_log,
                 DiskInterface* disk_interface)
    : state_(state), config_(config),
      plan_(this), disk_interface_(disk_interface),
      scan_(state, build_log, deps_log, disk_interface,
            &config_.depfile_parser_options) {
  status_ = new BuildStatus(config);
}